

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  ulong local_a0;
  string *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98 = withThis;
  uVar1 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  local_a0 = uVar1;
  if (uVar1 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(local_98->_M_dataplus)._M_p);
      puVar4 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar4) {
        local_b0 = *puVar4;
        lStack_a8 = plVar2[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *puVar4;
        local_c0 = (ulong *)*plVar2;
      }
      local_b8 = plVar2[1];
      *plVar2 = (long)puVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
      uVar5 = 0xf;
      if (local_c0 != &local_b0) {
        uVar5 = local_b0;
      }
      if (uVar5 < (ulong)(local_88 + local_b8)) {
        uVar5 = 0xf;
        if (local_90 != local_80) {
          uVar5 = local_80[0];
        }
        if (uVar5 < (ulong)(local_88 + local_b8)) goto LAB_001278b4;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_c0);
      }
      else {
LAB_001278b4:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_90);
      }
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_60 = *plVar2;
        uStack_58 = puVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar2;
        local_70 = (long *)*puVar3;
      }
      local_68 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      std::__cxx11::string::operator=((string *)str,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (str->_M_string_length - local_98->_M_string_length <= uVar1) break;
      uVar1 = std::__cxx11::string::find
                        ((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,
                         local_98->_M_string_length + uVar1);
    } while (uVar1 != 0xffffffffffffffff);
  }
  return local_a0 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }